

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::SectionTracking::TrackedSection::leave(TrackedSection *this)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  
  p_Var1 = (this->m_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar2 = (_Rb_tree_header *)p_Var1 == &(this->m_children)._M_t._M_impl.super__Rb_tree_header;
    if (bVar2) {
LAB_00187fb2:
      this->m_runState = Completed;
      return;
    }
    if (p_Var1[3]._M_color != 3) {
      this->m_runState = ExecutingChildren;
      if (!bVar2) {
        return;
      }
      goto LAB_00187fb2;
    }
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

void leave() {
            for( TrackedSections::const_iterator it = m_children.begin(), itEnd = m_children.end();
                    it != itEnd;
                    ++it )
                if( it->second.runState() != Completed ) {
                    m_runState = ExecutingChildren;
                    return;
                }
            m_runState = Completed;
        }